

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_line_profile_aa.cpp
# Opt level: O0

void __thiscall agg::line_profile_aa::width(line_profile_aa *this,double w)

{
  double dVar1;
  double local_20;
  double s;
  double w_local;
  line_profile_aa *this_local;
  
  s = w;
  if (w < 0.0) {
    s = 0.0;
  }
  dVar1 = s;
  if (*(double *)(this + 0x120) <= s) {
    dVar1 = *(double *)(this + 0x120);
  }
  s = dVar1 + s;
  s = s * 0.5 - *(double *)(this + 0x120);
  local_20 = *(double *)(this + 0x120);
  if (s < 0.0) {
    local_20 = s + local_20;
    s = 0.0;
  }
  set(this,s,local_20);
  return;
}

Assistant:

void line_profile_aa::width(double w)
    {
        if(w < 0.0) w = 0.0;

        if(w < m_smoother_width) w += w;
        else                     w += m_smoother_width;

        w *= 0.5;

        w -= m_smoother_width;
        double s = m_smoother_width;
        if(w < 0.0) 
        {
            s += w;
            w = 0.0;
        }
        set(w, s);
    }